

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O2

VertexIter __thiscall CMU462::HalfedgeMesh::newVertex(HalfedgeMesh *this)

{
  iterator iVar1;
  Vertex local_f8;
  
  local_f8.index = 0;
  local_f8.isNew = false;
  local_f8._89_3_ = 0;
  local_f8.offset = 0.0;
  local_f8.velocity = 0.0;
  local_f8._100_4_ = 0;
  local_f8.super_HalfedgeElement._vptr_HalfedgeElement = (_func_int **)&PTR_centroid_00280d98;
  local_f8.position.x = 0.0;
  local_f8.position.y = 0.0;
  local_f8.position.z = 0.0;
  local_f8.bindPosition.x = 0.0;
  local_f8.bindPosition.y = 0.0;
  local_f8.bindPosition.z = 0.0;
  local_f8.newPosition.x = 0.0;
  local_f8.newPosition.y = 0.0;
  local_f8.newPosition.z = 0.0;
  memset(&local_f8.quadric,0,0x88);
  iVar1 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::
          emplace<CMU462::Vertex>(&this->vertices,(const_iterator)&this->vertices,&local_f8);
  return (VertexIter)iVar1._M_node;
}

Assistant:

VertexIter newVertex() { return vertices.insert(vertices.end(), Vertex()); }